

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O1

bool __thiscall moira::Moira::writeOp<(moira::Mode)2,(moira::Size)1,64ul>(Moira *this,int n,u32 val)

{
  if ((uint)n < 8) {
    writeM<(moira::MemSpace)1,(moira::Size)1,64ul>
              (this,*(u32 *)((long)this->exec + (ulong)(uint)n * 4 + -0x38),val);
    return true;
  }
  __assert_fail("n < 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/elmerucr[P]E64-II/src/machine/cpu/Moira/MoiraDataflow_cpp.h"
                ,0x4c,
                "u32 moira::Moira::computeEA(u32) [M = moira::MODE_AI, S = moira::Byte, F = 0UL]");
}

Assistant:

bool
Moira::writeOp(int n, u32 val)
{
    // Handle non-memory modes
    if (M == MODE_DN) { writeD<S>(n, val); return true;  }
    if (M == MODE_AN) { writeA<S>(n, val); return true;  }
    if (M == MODE_IM) { assert(false);     return false; }

    // Compute effective address
    u32 ea = computeEA<M,S>(n);

    // Write to effective address
    bool error; writeM <M,S,F> (ea, val, error);

    // Emulate -(An) register modification
    updateAnPD<M,S>(n);

    // Early exit in case of an address error
    if (error) return false;
    
    // Emulate (An)+ register modification
    updateAnPI<M,S>(n);
    
    return !error;
}